

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O2

int run_test_udp_ref2(void)

{
  int iVar1;
  void *pvVar2;
  uv_loop_t *puVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *pcVar7;
  int64_t eval_b;
  int64_t eval_b_1;
  sockaddr_in addr;
  uv_udp_t h;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  pvVar2 = (void *)(long)iVar1;
  h.data = pvVar2;
  if (pvVar2 == (void *)0x0) {
    puVar3 = uv_default_loop();
    uv_udp_init(puVar3,&h);
    uv_udp_bind(&h,(sockaddr *)&addr,0);
    uv_udp_recv_start(&h,fail_cb,fail_cb);
    uv_unref((uv_handle_t *)&h);
    puVar3 = uv_default_loop();
    uv_run(puVar3,UV_RUN_DEFAULT);
    do_close(&h);
    puVar3 = uv_default_loop();
    close_loop(puVar3);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    lVar4 = (long)iVar1;
    if (lVar4 == 0) {
      uv_library_shutdown();
      return 0;
    }
    pcVar7 = "uv_loop_close(uv_default_loop())";
    pcVar6 = "0";
    uVar5 = 0x13f;
    pvVar2 = (void *)0x0;
  }
  else {
    pcVar7 = "0";
    pcVar6 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar5 = 0x138;
    lVar4 = 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ref.c"
          ,uVar5,pcVar6,"==",pcVar7,pvVar2,"==",lVar4);
  abort();
}

Assistant:

TEST_IMPL(udp_ref2) {
  struct sockaddr_in addr;
  uv_udp_t h;
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  uv_udp_init(uv_default_loop(), &h);
  uv_udp_bind(&h, (const struct sockaddr*) &addr, 0);
  uv_udp_recv_start(&h, (uv_alloc_cb)fail_cb, (uv_udp_recv_cb)fail_cb);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}